

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.h
# Opt level: O0

uint * __thiscall ON_MeshFaceList::QuadFvi(ON_MeshFaceList *this,uint face_index,uint *buffer)

{
  uint *puVar1;
  uint local_34;
  uint *p;
  uint *buffer_local;
  uint face_index_local;
  ON_MeshFaceList *this_local;
  
  if (face_index < this->m_face_count) {
    puVar1 = this->m_faces + face_index * this->m_face_stride;
    *buffer = *puVar1;
    buffer[1] = puVar1[1];
    buffer[2] = puVar1[2];
    if ((this->m_bQuadFaces & 1U) == 0) {
      local_34 = buffer[2];
    }
    else {
      local_34 = puVar1[3];
    }
    buffer[3] = local_34;
  }
  else {
    buffer[3] = 0;
    buffer[2] = 0;
    buffer[1] = 0;
    *buffer = 0;
  }
  return buffer;
}

Assistant:

inline unsigned int* QuadFvi(unsigned int face_index, unsigned int buffer[4]) const
  {
    if ( face_index < m_face_count )
    {
      const unsigned int* p = m_faces + (face_index*m_face_stride);
      buffer[0] = *p;
      buffer[1] = *(++p);
      buffer[2] = *(++p);
      buffer[3] = m_bQuadFaces ? *(++p) : buffer[2];
    }
    else
    {
      buffer[0] = buffer[1] = buffer[2] = buffer[3] = 0;
    }
    return buffer;
  }